

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

uint8 * load_jpeg_image(jpeg *z,int *out_x,int *out_y,int *comp,int req_comp)

{
  undefined1 uVar1;
  resample_row_func p_Var2;
  resample_row_func *pp_Var3;
  int iVar4;
  int *piVar5;
  uint8 *puVar6;
  long lVar7;
  resample_row_func local_198;
  int local_16c;
  uint8 *y_1;
  uint8 *y;
  int y_bot;
  stbi_resample *r_1;
  uint8 *out;
  stbi_resample *r;
  stbi_resample res_comp [4];
  uint8 *coutput [4];
  uint8 *output;
  uint j;
  uint i;
  int k;
  int decode_n;
  int n;
  int req_comp_local;
  int *comp_local;
  int *out_y_local;
  int *out_x_local;
  jpeg *z_local;
  
  if ((req_comp < 0) || (4 < req_comp)) {
    e("Internal error");
    z_local = (jpeg *)0x0;
  }
  else {
    (z->s).img_n = 0;
    iVar4 = decode_jpeg_image(z);
    if (iVar4 == 0) {
      cleanup_jpeg(z);
      z_local = (jpeg *)0x0;
    }
    else {
      local_16c = req_comp;
      if (req_comp == 0) {
        local_16c = (z->s).img_n;
      }
      if (((z->s).img_n == 3) && (local_16c < 3)) {
        i = 1;
      }
      else {
        i = (z->s).img_n;
      }
      for (j = 0; (int)j < (int)i; j = j + 1) {
        lVar7 = (long)(int)j;
        piVar5 = &res_comp[lVar7 + -1].ypos;
        puVar6 = (uint8 *)malloc((ulong)((z->s).img_x + 3));
        z->img_comp[(int)j].linebuf = puVar6;
        if (z->img_comp[(int)j].linebuf == (uint8 *)0x0) {
          cleanup_jpeg(z);
          e("Out of memory");
          return (uint8 *)0x0;
        }
        *(int *)&res_comp[lVar7].line1 = z->img_h_max / z->img_comp[(int)j].h;
        *(int *)((long)&res_comp[lVar7].line1 + 4) = z->img_v_max / z->img_comp[(int)j].v;
        res_comp[lVar7].vs = *(int *)((long)&res_comp[lVar7].line1 + 4) >> 1;
        res_comp[lVar7].hs =
             (((z->s).img_x + *(int *)&res_comp[lVar7].line1) - 1) / *(uint *)&res_comp[lVar7].line1
        ;
        res_comp[lVar7].w_lores = 0;
        p_Var2 = (resample_row_func)z->img_comp[(int)j].data;
        res_comp[lVar7].line0 = (uint8 *)p_Var2;
        res_comp[lVar7].resample = p_Var2;
        if ((*(int *)&res_comp[lVar7].line1 == 1) &&
           (*(int *)((long)&res_comp[lVar7].line1 + 4) == 1)) {
          *(code **)piVar5 = resample_row_1;
        }
        else if ((*(int *)&res_comp[lVar7].line1 == 1) &&
                (*(int *)((long)&res_comp[lVar7].line1 + 4) == 2)) {
          *(code **)piVar5 = resample_row_v_2;
        }
        else if ((*(int *)&res_comp[lVar7].line1 == 2) &&
                (*(int *)((long)&res_comp[lVar7].line1 + 4) == 1)) {
          *(code **)piVar5 = resample_row_h_2;
        }
        else if ((*(int *)&res_comp[lVar7].line1 == 2) &&
                (*(int *)((long)&res_comp[lVar7].line1 + 4) == 2)) {
          *(code **)piVar5 = resample_row_hv_2;
        }
        else {
          *(code **)piVar5 = resample_row_generic;
        }
      }
      z_local = (jpeg *)malloc((ulong)(local_16c * (z->s).img_x * (z->s).img_y + 1));
      if (z_local == (jpeg *)0x0) {
        cleanup_jpeg(z);
        e("Out of memory");
        z_local = (jpeg *)0x0;
      }
      else {
        for (output._0_4_ = 0; (uint)output < (z->s).img_y; output._0_4_ = (uint)output + 1) {
          r_1 = (stbi_resample *)
                (z_local->huff_dc[0].fast +
                ((ulong)(local_16c * (z->s).img_x * (uint)output) - 0x28));
          for (j = 0; (int)j < (int)i; j = j + 1) {
            lVar7 = (long)(int)j;
            if (res_comp[lVar7].vs < *(int *)((long)&res_comp[lVar7].line1 + 4) >> 1) {
              p_Var2 = res_comp[lVar7].resample;
              local_198 = (resample_row_func)res_comp[lVar7].line0;
            }
            else {
              p_Var2 = (resample_row_func)res_comp[lVar7].line0;
              local_198 = res_comp[lVar7].resample;
            }
            puVar6 = (uint8 *)(**(code **)&res_comp[lVar7 + -1].ypos)
                                        (z->img_comp[(int)j].linebuf,p_Var2,local_198,
                                         res_comp[lVar7].hs,*(undefined4 *)&res_comp[lVar7].line1);
            coutput[(long)(int)j + -1] = puVar6;
            iVar4 = res_comp[lVar7].vs + 1;
            res_comp[lVar7].vs = iVar4;
            if (*(int *)((long)&res_comp[lVar7].line1 + 4) <= iVar4) {
              res_comp[lVar7].vs = 0;
              res_comp[lVar7].resample = (resample_row_func)res_comp[lVar7].line0;
              iVar4 = res_comp[lVar7].w_lores + 1;
              res_comp[lVar7].w_lores = iVar4;
              if (iVar4 < z->img_comp[(int)j].y) {
                res_comp[lVar7].line0 = res_comp[lVar7].line0 + z->img_comp[(int)j].w2;
              }
            }
          }
          if (local_16c < 3) {
            if (local_16c == 1) {
              for (output._4_4_ = 0; output._4_4_ < (z->s).img_x; output._4_4_ = output._4_4_ + 1) {
                *(uint8 *)((long)&r_1->resample + (ulong)output._4_4_) =
                     *(uint8 *)(res_comp[3]._40_8_ + (ulong)output._4_4_);
              }
            }
            else {
              for (output._4_4_ = 0; output._4_4_ < (z->s).img_x; output._4_4_ = output._4_4_ + 1) {
                pp_Var3 = &r_1->resample;
                *(undefined1 *)&r_1->resample =
                     *(undefined1 *)(res_comp[3]._40_8_ + (ulong)output._4_4_);
                r_1 = (stbi_resample *)((long)&r_1->resample + 2);
                *(undefined1 *)((long)pp_Var3 + 1) = 0xff;
              }
            }
          }
          else if ((z->s).img_n == 3) {
            YCbCr_to_RGB_row((uint8 *)r_1,(uint8 *)res_comp[3]._40_8_,coutput[0],coutput[1],
                             (z->s).img_x,local_16c);
          }
          else {
            for (output._4_4_ = 0; output._4_4_ < (z->s).img_x; output._4_4_ = output._4_4_ + 1) {
              uVar1 = *(undefined1 *)(res_comp[3]._40_8_ + (ulong)output._4_4_);
              *(undefined1 *)((long)&r_1->resample + 2) = uVar1;
              *(undefined1 *)((long)&r_1->resample + 1) = uVar1;
              *(undefined1 *)&r_1->resample = uVar1;
              *(undefined1 *)((long)&r_1->resample + 3) = 0xff;
              r_1 = (stbi_resample *)((long)&r_1->resample + (long)local_16c);
            }
          }
        }
        cleanup_jpeg(z);
        *out_x = (z->s).img_x;
        *out_y = (z->s).img_y;
        if (comp != (int *)0x0) {
          *comp = (z->s).img_n;
        }
      }
    }
  }
  return (uint8 *)z_local;
}

Assistant:

static uint8 *load_jpeg_image(jpeg *z, int *out_x, int *out_y, int *comp, int req_comp)
{
   int n, decode_n;
   // validate req_comp
   if (req_comp < 0 || req_comp > 4) return epuc("bad req_comp", "Internal error");
   z->s.img_n = 0;

   // load a jpeg image from whichever source
   if (!decode_jpeg_image(z)) { cleanup_jpeg(z); return NULL; }

   // determine actual number of components to generate
   n = req_comp ? req_comp : z->s.img_n;

   if (z->s.img_n == 3 && n < 3)
      decode_n = 1;
   else
      decode_n = z->s.img_n;

   // resample and color-convert
   {
      int k;
      uint i,j;
      uint8 *output;
      uint8 *coutput[4];

      stbi_resample res_comp[4];

      for (k=0; k < decode_n; ++k) {
         stbi_resample *r = &res_comp[k];

         // allocate line buffer big enough for upsampling off the edges
         // with upsample factor of 4
         z->img_comp[k].linebuf = (uint8 *) malloc(z->s.img_x + 3);
         if (!z->img_comp[k].linebuf) { cleanup_jpeg(z); return epuc("outofmem", "Out of memory"); }

         r->hs      = z->img_h_max / z->img_comp[k].h;
         r->vs      = z->img_v_max / z->img_comp[k].v;
         r->ystep   = r->vs >> 1;
         r->w_lores = (z->s.img_x + r->hs-1) / r->hs;
         r->ypos    = 0;
         r->line0   = r->line1 = z->img_comp[k].data;

         if      (r->hs == 1 && r->vs == 1) r->resample = resample_row_1;
         else if (r->hs == 1 && r->vs == 2) r->resample = resample_row_v_2;
         else if (r->hs == 2 && r->vs == 1) r->resample = resample_row_h_2;
         else if (r->hs == 2 && r->vs == 2) r->resample = resample_row_hv_2;
         else                               r->resample = resample_row_generic;
      }

      // can't error after this so, this is safe
      output = (uint8 *) malloc(n * z->s.img_x * z->s.img_y + 1);
      if (!output) { cleanup_jpeg(z); return epuc("outofmem", "Out of memory"); }

      // now go ahead and resample
      for (j=0; j < z->s.img_y; ++j) {
         uint8 *out = output + n * z->s.img_x * j;
         for (k=0; k < decode_n; ++k) {
            stbi_resample *r = &res_comp[k];
            int y_bot = r->ystep >= (r->vs >> 1);
            coutput[k] = r->resample(z->img_comp[k].linebuf,
                                     y_bot ? r->line1 : r->line0,
                                     y_bot ? r->line0 : r->line1,
                                     r->w_lores, r->hs);
            if (++r->ystep >= r->vs) {
               r->ystep = 0;
               r->line0 = r->line1;
               if (++r->ypos < z->img_comp[k].y)
                  r->line1 += z->img_comp[k].w2;
            }
         }
         if (n >= 3) {
            uint8 *y = coutput[0];
            if (z->s.img_n == 3) {
               #if STBI_SIMD
               stbi_YCbCr_installed(out, y, coutput[1], coutput[2], z->s.img_x, n);
               #else
               YCbCr_to_RGB_row(out, y, coutput[1], coutput[2], z->s.img_x, n);
               #endif
            } else
               for (i=0; i < z->s.img_x; ++i) {
                  out[0] = out[1] = out[2] = y[i];
                  out[3] = 255; // not used if n==3
                  out += n;
               }
         } else {
            uint8 *y = coutput[0];
            if (n == 1)
               for (i=0; i < z->s.img_x; ++i) out[i] = y[i];
            else
               for (i=0; i < z->s.img_x; ++i) *out++ = y[i], *out++ = 255;
         }
      }
      cleanup_jpeg(z);
      *out_x = z->s.img_x;
      *out_y = z->s.img_y;
      if (comp) *comp  = z->s.img_n; // report original components, not output
      return output;
   }
}